

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

void mbedtls_net_usleep(unsigned_long usec)

{
  undefined1 local_20 [8];
  timeval tv;
  unsigned_long usec_local;
  
  local_20 = (undefined1  [8])(usec / 1000000);
  tv.tv_sec = (long)usec % 1000000;
  tv.tv_usec = usec;
  select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_20);
  return;
}

Assistant:

void mbedtls_net_usleep( unsigned long usec )
{
#if defined(_WIN32)
    Sleep( ( usec + 999 ) / 1000 );
#else
    struct timeval tv;
    tv.tv_sec  = usec / 1000000;
#if defined(__unix__) || defined(__unix) || \
    ( defined(__APPLE__) && defined(__MACH__) )
    tv.tv_usec = (suseconds_t) usec % 1000000;
#else
    tv.tv_usec = usec % 1000000;
#endif
    select( 0, NULL, NULL, NULL, &tv );
#endif
}